

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O2

void __thiscall
icu_63::OlsonTimeZone::getHistoricalOffset
          (OlsonTimeZone *this,UDate date,UBool local,int32_t NonExistingTimeOpt,
          int32_t DuplicatedTimeOpt,int32_t *rawoff,int32_t *dstoff)

{
  uint uVar1;
  uint uVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int iVar6;
  int64_t iVar7;
  int *piVar8;
  ulong uVar9;
  ushort transIdx;
  ushort uVar10;
  bool bVar11;
  bool bVar12;
  double dVar13;
  
  transIdx = this->transitionCount32 + this->transitionCountPre32 + this->transitionCountPost32;
  if ((short)transIdx < 1) {
    piVar8 = this->typeOffsets;
  }
  else {
    dVar13 = uprv_floor_63(date / 1000.0);
    if ((local != '\0') || (iVar7 = transitionTimeInSeconds(this,0), (double)iVar7 <= dVar13)) {
      uVar1 = NonExistingTimeOpt & 3;
      uVar2 = DuplicatedTimeOpt & 3;
      do {
        uVar10 = transIdx;
        transIdx = uVar10 - 1;
        if ((short)transIdx < 0) {
          uVar9 = 0;
          goto LAB_00261cba;
        }
        iVar7 = transitionTimeInSeconds(this,transIdx);
        if ((local != '\0') && ((double)(iVar7 + -0x15180) <= dVar13)) {
          iVar3 = zoneOffsetAt(this,uVar10 - 2);
          iVar4 = dstOffsetAt(this,uVar10 - 2);
          bVar11 = iVar4 != 0;
          iVar4 = zoneOffsetAt(this,transIdx);
          iVar5 = dstOffsetAt(this,transIdx);
          bVar12 = iVar5 == 0;
          if (iVar4 < iVar3) {
            iVar5 = iVar4;
            if ((uVar2 != 3 || (bVar12 || bVar11)) && (uVar2 != 1 || (!bVar12 || !bVar11))) {
              if ((DuplicatedTimeOpt & 0xcU) == 4) {
                iVar4 = iVar3;
              }
              iVar5 = iVar3;
              if (!bVar12 || !bVar11) {
                iVar5 = iVar4;
              }
              if (uVar2 == 3) {
                iVar4 = iVar5;
              }
              if (bVar12 || bVar11) {
                iVar3 = iVar4;
              }
              iVar5 = iVar3;
              if (uVar2 != 1) {
                iVar5 = iVar4;
              }
            }
          }
          else {
            iVar5 = iVar3;
            if ((uVar1 != 3 || (bVar12 || bVar11)) && (uVar1 != 1 || (!bVar12 || !bVar11))) {
              if ((NonExistingTimeOpt & 0xcU) != 0xc) {
                iVar3 = iVar4;
              }
              iVar5 = iVar4;
              if (!bVar12 || !bVar11) {
                iVar5 = iVar3;
              }
              if (uVar1 == 3) {
                iVar3 = iVar5;
              }
              if (bVar12 || bVar11) {
                iVar4 = iVar3;
              }
              iVar5 = iVar4;
              if (uVar1 != 1) {
                iVar5 = iVar3;
              }
            }
          }
          iVar7 = iVar7 + iVar5;
        }
      } while (dVar13 < (double)iVar7);
      uVar9 = (ulong)((uint)this->typeMapData[transIdx] * 2);
LAB_00261cba:
      *rawoff = this->typeOffsets[uVar9] * 1000;
      iVar6 = dstOffsetAt(this,uVar10 - 1);
      goto LAB_00261ce0;
    }
    piVar8 = this->typeOffsets;
  }
  *rawoff = *piVar8 * 1000;
  iVar6 = piVar8[1];
LAB_00261ce0:
  *dstoff = iVar6 * 1000;
  return;
}

Assistant:

void
OlsonTimeZone::getHistoricalOffset(UDate date, UBool local,
                                   int32_t NonExistingTimeOpt, int32_t DuplicatedTimeOpt,
                                   int32_t& rawoff, int32_t& dstoff) const {
    U_DEBUG_TZ_MSG(("getHistoricalOffset(%.1f, %s, %d, %d, raw, dst)\n",
        date, local?"T":"F", NonExistingTimeOpt, DuplicatedTimeOpt));
#if defined U_DEBUG_TZ
        printTime(date*1000.0);
#endif
    int16_t transCount = transitionCount();

    if (transCount > 0) {
        double sec = uprv_floor(date / U_MILLIS_PER_SECOND);
        if (!local && sec < transitionTimeInSeconds(0)) {
            // Before the first transition time
            rawoff = initialRawOffset() * U_MILLIS_PER_SECOND;
            dstoff = initialDstOffset() * U_MILLIS_PER_SECOND;
        } else {
            // Linear search from the end is the fastest approach, since
            // most lookups will happen at/near the end.
            int16_t transIdx;
            for (transIdx = transCount - 1; transIdx >= 0; transIdx--) {
                int64_t transition = transitionTimeInSeconds(transIdx);

                if (local && (sec >= (transition - MAX_OFFSET_SECONDS))) {
                    int32_t offsetBefore = zoneOffsetAt(transIdx - 1);
                    UBool dstBefore = dstOffsetAt(transIdx - 1) != 0;

                    int32_t offsetAfter = zoneOffsetAt(transIdx);
                    UBool dstAfter = dstOffsetAt(transIdx) != 0;

                    UBool dstToStd = dstBefore && !dstAfter;
                    UBool stdToDst = !dstBefore && dstAfter;
                    
                    if (offsetAfter - offsetBefore >= 0) {
                        // Positive transition, which makes a non-existing local time range
                        if (((NonExistingTimeOpt & kStdDstMask) == kStandard && dstToStd)
                                || ((NonExistingTimeOpt & kStdDstMask) == kDaylight && stdToDst)) {
                            transition += offsetBefore;
                        } else if (((NonExistingTimeOpt & kStdDstMask) == kStandard && stdToDst)
                                || ((NonExistingTimeOpt & kStdDstMask) == kDaylight && dstToStd)) {
                            transition += offsetAfter;
                        } else if ((NonExistingTimeOpt & kFormerLatterMask) == kLatter) {
                            transition += offsetBefore;
                        } else {
                            // Interprets the time with rule before the transition,
                            // default for non-existing time range
                            transition += offsetAfter;
                        }
                    } else {
                        // Negative transition, which makes a duplicated local time range
                        if (((DuplicatedTimeOpt & kStdDstMask) == kStandard && dstToStd)
                                || ((DuplicatedTimeOpt & kStdDstMask) == kDaylight && stdToDst)) {
                            transition += offsetAfter;
                        } else if (((DuplicatedTimeOpt & kStdDstMask) == kStandard && stdToDst)
                                || ((DuplicatedTimeOpt & kStdDstMask) == kDaylight && dstToStd)) {
                            transition += offsetBefore;
                        } else if ((DuplicatedTimeOpt & kFormerLatterMask) == kFormer) {
                            transition += offsetBefore;
                        } else {
                            // Interprets the time with rule after the transition,
                            // default for duplicated local time range
                            transition += offsetAfter;
                        }
                    }
                }
                if (sec >= transition) {
                    break;
                }
            }
            // transIdx could be -1 when local=true
            rawoff = rawOffsetAt(transIdx) * U_MILLIS_PER_SECOND;
            dstoff = dstOffsetAt(transIdx) * U_MILLIS_PER_SECOND;
        }
    } else {
        // No transitions, single pair of offsets only
        rawoff = initialRawOffset() * U_MILLIS_PER_SECOND;
        dstoff = initialDstOffset() * U_MILLIS_PER_SECOND;
    }
    U_DEBUG_TZ_MSG(("getHistoricalOffset(%.1f, %s, %d, %d, raw, dst) - raw=%d, dst=%d\n",
        date, local?"T":"F", NonExistingTimeOpt, DuplicatedTimeOpt, rawoff, dstoff));
}